

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularQueue.hpp
# Opt level: O2

void __thiscall
antlr::CircularQueue<antlr::TokenRefCount<antlr::Token>_>::removeItems
          (CircularQueue<antlr::TokenRefCount<antlr::Token>_> *this,size_t nb)

{
  const_iterator __first;
  ulong uVar1;
  ulong uVar2;
  size_t sVar3;
  
  __first._M_current =
       (this->storage).
       super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = this->m_offset;
  uVar2 = ((long)(this->storage).
                 super__Vector_base<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)__first._M_current >> 3) - uVar1
  ;
  if (nb <= uVar2) {
    uVar2 = nb;
  }
  if (uVar1 < 5000) {
    sVar3 = uVar2 + uVar1;
  }
  else {
    std::
    vector<antlr::TokenRefCount<antlr::Token>,_std::allocator<antlr::TokenRefCount<antlr::Token>_>_>
    ::erase(&this->storage,__first,__first._M_current + uVar1 + uVar2);
    sVar3 = 0;
  }
  this->m_offset = sVar3;
  return;
}

Assistant:

inline void removeItems( size_t nb )
	{
		// it would be nice if we would not get called with nb > entries
		// (or to be precise when entries() == 0)
		// This case is possible when lexer/parser::recover() calls
		// consume+consumeUntil when the queue is empty.
		// In recover the consume says to prepare to read another
		// character/token. Then in the subsequent consumeUntil the
		// LA() call will trigger
		// syncConsume which calls this method *before* the same queue
		// has been sufficiently filled.
		if( nb > entries() )
			nb = entries();

		if (m_offset >= OFFSET_MAX_RESIZE)
		{
			storage.erase( storage.begin(), storage.begin() + m_offset + nb );
			m_offset = 0;
		}
		else
			m_offset += nb;
	}